

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QPointF __thiscall QGraphicsViewPrivate::mapToScene(QGraphicsViewPrivate *this,QPointF *point)

{
  double dVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double dVar3;
  QPointF QVar4;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = point->xp;
  dVar3 = point->yp;
  uVar2 = *(uint *)&this->field_0x300;
  if ((uVar2 & 0x20) == 0) {
    dVar1 = (double)this->scrollX + dVar1;
  }
  else {
    updateScroll(this);
    uVar2 = *(uint *)&this->field_0x300;
    dVar1 = (double)this->scrollX + dVar1;
    if ((uVar2 & 0x20) != 0) {
      updateScroll(this);
      uVar2 = *(uint *)&this->field_0x300;
    }
  }
  dVar3 = (double)this->scrollY + dVar3;
  if ((uVar2 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    dVar1 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar4.yp = dVar3;
    QVar4.xp = dVar1;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsViewPrivate::mapToScene(const QPointF &point) const
{
    QPointF p = point;
    p.rx() += horizontalScroll();
    p.ry() += verticalScroll();
    return identityMatrix ? p : matrix.inverted().map(p);
}